

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.h
# Opt level: O3

void __thiscall
CppWebSpider::response::response
          (response *this,string *host,string *uri,string *content,CookieJar *cookie)

{
  pointer pcVar1;
  string local_50;
  
  this->status_code = -1;
  (this->protocol)._M_dataplus._M_p = (pointer)&(this->protocol).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->protocol,"");
  (this->host)._M_dataplus._M_p = (pointer)&(this->host).field_2;
  pcVar1 = (host->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->host,pcVar1,pcVar1 + host->_M_string_length);
  (this->uri)._M_dataplus._M_p = (pointer)&(this->uri).field_2;
  pcVar1 = (uri->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->uri,pcVar1,pcVar1 + uri->_M_string_length);
  (this->content)._M_dataplus._M_p = (pointer)&(this->content).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->content,"");
  *(undefined8 *)&(this->headers)._M_h._M_rehash_policy = 0;
  (this->headers)._M_h._M_buckets = &(this->headers)._M_h._M_single_bucket;
  (this->headers)._M_h._M_bucket_count = 1;
  (this->headers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->headers)._M_h._M_element_count = 0;
  (this->headers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->headers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->headers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (content->_M_string_length != 0) {
    pcVar1 = (content->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + content->_M_string_length);
    parse(this,&local_50,cookie);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

response(std::string host,std::string uri,std::string content,CookieJar *cookie):status_code(-1),
														protocol(""),
														host(host),
														uri(uri),
														content(""),
														headers(std::unordered_map<std::string,std::string>())
		{
			//假如爬虫返回的原始的的http数据不为空才parse
			if(content.size()!=0)
				parse(content,cookie);
		}